

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O0

StateVector * __thiscall
testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::Matrix<double,4,1,0,4,1>const&,Eigen
::Matrix<double,1,1,0,1,1>_const__unsigned_int_
          (StateVector *__return_storage_ptr__,void *this,StateVector *xk,InputVector *u,uint k)

{
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *this_00;
  CoeffReturnType CVar1;
  non_const_type local_1f8;
  Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>
  local_1f0;
  CoeffReturnType local_1e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  local_1d8;
  non_const_type local_1b0;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_1a8;
  double local_198;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  local_190;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> local_168;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_158;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  local_118;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_c0;
  uint local_2c;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *pDStack_28;
  uint k_local;
  InputVector *u_local;
  StateVector *xk_local;
  KalmanFunctor *this_local;
  StateVector *xk1;
  
  local_2c = k;
  pDStack_28 = (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)u;
  u_local = (InputVector *)xk;
  xk_local = (StateVector *)this;
  this_local = (KalmanFunctor *)__return_storage_ptr__;
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix(__return_storage_ptr__);
  local_168 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)((long)this + 0x80),
                         (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)u_local);
  local_1b0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)u_local);
  local_1a8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,4,1,0,4,1>const>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,4,1,0,4,1>const>> *)
                         &local_1b0,(MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)u_local);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_0>
          ::operator[]((DenseCoeffsBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_0>
                        *)&local_1a8,0);
  local_198 = cos(CVar1 * 10.0);
  Eigen::operator*(&local_190,&local_198,(StorageBaseType *)((long)this + 0x10));
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>::
  operator+(&local_158,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
             *)&local_168,
            (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
             *)&local_190);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
  ::operator+(&local_118,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>>
               *)&local_158,(MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)((long)this + 0x30)
             );
  this_00 = pDStack_28;
  local_1f8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::transpose(pDStack_28);
  local_1f0 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,1,1,0,1,1>> *)this_00,
                         (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          *)&local_1f8);
  local_1e0 = Eigen::
              DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>,_0>
              ::operator[]((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_0>,_0>
                            *)&local_1f0,0);
  Eigen::operator*(&local_1d8,&local_1e0,(StorageBaseType *)((long)this + 0x10));
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::Matrix<double,4,1,0,4,1>const>>
  ::operator+(&local_c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const,Eigen::Matrix<double,4,1,0,4,1>const>const>const,Eigen::Matrix<double,4,1,0,4,1>const>>
               *)&local_118,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
               *)&local_1d8);
  Eigen::Matrix<double,4,1,0,4,1>::operator=
            ((Matrix<double,4,1,0,4,1> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

virtual ekf::StateVector stateDynamics(const ekf::StateVector& xk, const ekf::InputVector& u, unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::StateVector xk1;
            xk1=a_*xk+cos(10*(xk.transpose()*xk)[0])*s_+t_+(u*u.transpose())[0]*s_;
            return xk1;
        }